

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetDampingAA(void *kinmem,sunrealtype beta)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0xd5;
  }
  else {
    if (0.0 < beta) {
      if (1.0 <= beta) {
        *(undefined8 *)((long)kinmem + 0x198) = 0x3ff0000000000000;
        *(undefined4 *)((long)kinmem + 0x1e8) = 0;
      }
      else {
        *(sunrealtype *)((long)kinmem + 0x198) = beta;
        *(undefined4 *)((long)kinmem + 0x1e8) = 1;
      }
      return 0;
    }
    msgfmt = "beta <= 0 illegal";
    iVar1 = -2;
    error_code = -2;
    line = 0xde;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetDampingAA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetDampingAA(void* kinmem, sunrealtype beta)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check for illegal input value */
  if (beta <= ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "beta <= 0 illegal");
    return (KIN_ILL_INPUT);
  }

  if (beta < ONE)
  {
    /* enable damping */
    kin_mem->kin_beta_aa    = beta;
    kin_mem->kin_damping_aa = SUNTRUE;
  }
  else
  {
    /* disable damping */
    kin_mem->kin_beta_aa    = ONE;
    kin_mem->kin_damping_aa = SUNFALSE;
  }

  return (KIN_SUCCESS);
}